

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O3

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CPrintStm *stm)

{
  TypeInfo *left;
  IExpression *pIVar1;
  undefined1 *puVar2;
  CError *pCVar3;
  bool bVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  TypeInfo *in_RCX;
  string errorMessage;
  CError local_80;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: CPrintStm\n",0x17);
  pIVar1 = (stm->expression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar1 == (IExpression *)0x0) {
    CError::CError(&local_80,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>(&this->errors,&local_80);
    pCVar3 = &local_80;
  }
  else {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
    left = &this->lastCalculatedType;
    TypeInfo::TypeInfo((TypeInfo *)&local_80,ERROR_TYPE);
    bVar4 = operator==(left,(TypeInfo *)&local_80);
    puVar2 = (undefined1 *)((long)&local_80.message.field_2 + 8);
    if ((undefined1 *)local_80.message._M_string_length != puVar2) {
      operator_delete((void *)local_80.message._M_string_length);
    }
    if (bVar4) {
      return;
    }
    TypeInfo::TypeInfo((TypeInfo *)&local_80,INT);
    bVar4 = operator!=(left,(TypeInfo *)&local_80);
    if ((undefined1 *)local_80.message._M_string_length != puVar2) {
      operator_delete((void *)local_80.message._M_string_length);
    }
    if (!bVar4) {
      return;
    }
    TypeInfo::TypeInfo((TypeInfo *)&local_80,INT);
    CError::GetTypeErrorMessage_abi_cxx11_(&local_50,&local_80,left,in_RCX);
    if ((undefined1 *)local_80.message._M_string_length != puVar2) {
      operator_delete((void *)local_80.message._M_string_length);
    }
    CError::CError(&local_80,&local_50,&(stm->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>(&this->errors,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.message._M_dataplus._M_p != &local_80.message.field_2) {
      operator_delete(local_80.message._M_dataplus._M_p);
    }
    pCVar3 = (CError *)&local_50;
  }
  paVar5 = &(pCVar3->message).field_2;
  puVar2 = *(undefined1 **)(paVar5->_M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 != paVar5) {
    operator_delete(puVar2);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CPrintStm &stm ) 
{
    std::cout << "typechecker: CPrintStm\n";

    if( stm.expression ) {
        stm.expression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
        if( lastCalculatedType != enums::TPrimitiveType::INT ) {
            auto errorMessage = CError::GetTypeErrorMessage(enums::TPrimitiveType::INT, lastCalculatedType);
            errors.push_back(CError(errorMessage, stm.position));
        }
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}